

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  undefined4 *puVar2;
  bool bVar3;
  bool bVar4;
  connectdata *conn_00;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  _Bool *p_Var14;
  SessionHandle *pSVar15;
  long lVar16;
  undefined1 connected;
  char *value;
  char *name;
  char *local_60;
  void *local_58;
  char *local_50;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *done = false;
  pSVar15 = conn->data;
  local_58 = (pSVar15->req).protop;
  pcVar13 = (pSVar15->state).path;
  lVar16 = 1;
  pcVar12 = pcVar13 + -1;
  local_40 = done;
  local_38 = conn;
  do {
    pcVar11 = pcVar12;
    pcVar12 = pcVar11 + 1;
    _Var5 = imap_is_bchar(pcVar11[1]);
    lVar16 = lVar16 + -1;
  } while (_Var5);
  if (lVar16 == 0) {
    *(undefined8 *)((long)local_58 + 8) = 0;
LAB_00484dc5:
    uVar10 = (ulong)pcVar13 & 0xffffffff;
LAB_00484dc8:
    if (*pcVar12 == ';') goto code_r0x00484dd3;
    if (((*(long *)((long)local_58 + 8) == 0) || (*pcVar12 != '?')) ||
       (*(long *)((long)local_58 + 0x18) != 0)) goto LAB_004850b8;
    pcVar13 = pcVar12 + 1;
    sVar9 = 0xffffffffffffffff;
    do {
      pcVar11 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
      _Var5 = imap_is_bchar(*pcVar11);
      sVar9 = sVar9 + 1;
    } while (_Var5);
    CVar6 = Curl_urldecode(pSVar15,pcVar13,sVar9,(char **)((long)local_58 + 0x30),(size_t *)0x0,true
                          );
    if (CVar6 == CURLE_OK) {
LAB_004850b8:
      CVar6 = (uint)(*pcVar12 != '\0') * 3;
    }
  }
  else {
    pcVar8 = pcVar12;
    if ((pcVar13 < pcVar12) && (pcVar8 = pcVar11, *pcVar11 != '/')) {
      pcVar8 = pcVar12;
    }
    CVar6 = Curl_urldecode(pSVar15,pcVar13,(long)pcVar8 - (long)pcVar13,
                           (char **)((long)local_58 + 8),(size_t *)0x0,true);
    pcVar13 = (char *)(ulong)CVar6;
    if (CVar6 == CURLE_OK) goto LAB_00484dc5;
  }
LAB_004850c4:
  conn_00 = local_38;
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  pSVar15 = local_38->data;
  pcVar13 = (pSVar15->set).str[4];
  if (pcVar13 == (char *)0x0) {
LAB_00485123:
    CVar6 = CURLE_OK;
  }
  else {
    pvVar1 = (pSVar15->req).protop;
    CVar6 = Curl_urldecode(pSVar15,pcVar13,0,(char **)((long)pvVar1 + 0x38),(size_t *)0x0,true);
    if (CVar6 == CURLE_OK) {
      pcVar13 = *(char **)((long)pvVar1 + 0x38);
      for (pcVar12 = pcVar13; *pcVar12 != '\0'; pcVar12 = pcVar12 + 1) {
        if (*pcVar12 == ' ') {
          pcVar12 = (*Curl_cstrdup)(pcVar12);
          *(char **)((long)pvVar1 + 0x40) = pcVar12;
          *pcVar13 = '\0';
          CVar6 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)pvVar1 + 0x40) != 0) {
            CVar6 = CURLE_OK;
          }
          goto LAB_00485125;
        }
        pcVar13 = pcVar13 + 1;
      }
      goto LAB_00485123;
    }
  }
LAB_00485125:
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  pSVar15 = conn_00->data;
  (pSVar15->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar15,0);
  Curl_pgrsSetDownloadCounter(pSVar15,0);
  Curl_pgrsSetUploadSize(pSVar15,-1);
  pcVar13 = (char *)0xffffffffffffffff;
  Curl_pgrsSetDownloadSize(pSVar15,-1);
  pSVar15 = conn_00->data;
  puVar2 = (undefined4 *)(pSVar15->req).protop;
  if ((pSVar15->set).opt_no_body == true) {
    *puVar2 = 1;
  }
  *local_40 = false;
  pcVar12 = *(char **)(puVar2 + 2);
  if ((((pcVar12 == (char *)0x0) ||
       (pcVar13 = (conn_00->proto).ftpc.prevpath, pcVar13 == (char *)0x0)) ||
      (iVar7 = strcmp(pcVar12,pcVar13), iVar7 != 0)) ||
     (((*(char **)(puVar2 + 4) != (char *)0x0 &&
       (pcVar13 = (conn_00->proto).imapc.mailbox_uidvalidity, pcVar13 != (char *)0x0)) &&
      (iVar7 = strcmp(*(char **)(puVar2 + 4),pcVar13), iVar7 != 0)))) {
    connected = SUB81(pcVar13,0);
    bVar3 = false;
  }
  else {
    connected = SUB81(pcVar13,0);
    bVar3 = true;
  }
  if ((pSVar15->set).upload == true) {
    if (pcVar12 == (char *)0x0) {
      pcVar13 = "Cannot APPEND without a mailbox.";
LAB_004852a5:
      Curl_failf(pSVar15,pcVar13);
      connected = SUB81(pcVar13,0);
      CVar6 = CURLE_URL_MALFORMAT;
      goto LAB_004853c1;
    }
    if ((pSVar15->state).infilesize < 0) {
      connected = 0xe8;
      Curl_failf(pSVar15,"Cannot APPEND with unknown input file size\n");
      CVar6 = CURLE_UPLOAD_FAILED;
      goto LAB_004853c1;
    }
    pcVar13 = imap_atom(pcVar12);
    if (pcVar13 != (char *)0x0) {
      connected = 0x14;
      CVar6 = imap_sendf(conn_00,"APPEND %s (\\Seen) {%ld}",pcVar13,
                         (conn_00->data->state).infilesize);
      (*Curl_cfree)(pcVar13);
      if (CVar6 == CURLE_OK) {
        (conn_00->proto).imapc.state = IMAP_APPEND;
      }
      goto LAB_004853c1;
    }
LAB_004853bc:
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
  else {
    lVar16 = *(long *)(puVar2 + 0xe);
    connected = lVar16 == 0;
    bVar4 = (bool)(pcVar12 == (char *)0x0 | bVar3);
    if (!bVar4 || (bool)connected) {
      connected = lVar16 != 0;
      if (bVar3 && !(bool)connected) {
        if (*(long *)(puVar2 + 6) != 0) {
          CVar6 = imap_perform_fetch(conn_00);
          goto LAB_004853c1;
        }
        if (*(long *)(puVar2 + 0xc) != 0) {
          CVar6 = imap_perform_search(conn_00);
          goto LAB_004853c1;
        }
      }
      if ((!bVar4) &&
         (((lVar16 != 0 || (*(long *)(puVar2 + 6) != 0)) || (*(long *)(puVar2 + 0xc) != 0)))) {
        pcVar13 = (conn_00->proto).ftpc.prevpath;
        if (pcVar13 != (char *)0x0) {
          (*Curl_cfree)(pcVar13);
          (conn_00->proto).ftpc.prevpath = (char *)0x0;
        }
        pcVar13 = (conn_00->proto).imapc.mailbox_uidvalidity;
        if (pcVar13 != (char *)0x0) {
          (*Curl_cfree)(pcVar13);
          (conn_00->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        }
        if (*(char **)(puVar2 + 2) == (char *)0x0) {
          pSVar15 = conn_00->data;
          pcVar13 = "Cannot SELECT without a mailbox.";
          goto LAB_004852a5;
        }
        pcVar13 = imap_atom(*(char **)(puVar2 + 2));
        if (pcVar13 != (char *)0x0) {
          connected = 0x4d;
          CVar6 = imap_sendf(conn_00,"SELECT %s",pcVar13);
          (*Curl_cfree)(pcVar13);
          if (CVar6 == CURLE_OK) {
            (conn_00->proto).imapc.state = IMAP_SELECT;
          }
          goto LAB_004853c1;
        }
        goto LAB_004853bc;
      }
    }
    CVar6 = imap_perform_list(conn_00);
  }
LAB_004853c1:
  if (CVar6 == CURLE_OK) {
    p_Var14 = local_40;
    CVar6 = imap_multi_statemach(conn_00,local_40);
    connected = SUB81(p_Var14,0);
  }
  if ((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, *local_40 == true)) {
    imap_dophase_done(conn_00,(_Bool)connected);
  }
  return CVar6;
code_r0x00484dd3:
  pcVar13 = pcVar12 + 1;
  sVar9 = 0;
  pcVar12 = pcVar13;
LAB_00484ddb:
  if (*pcVar12 == '\0') {
    uVar10 = 3;
LAB_00484e19:
    bVar3 = false;
  }
  else {
    if (*pcVar12 != '=') goto code_r0x00484de8;
    bVar3 = false;
    CVar6 = Curl_urldecode(pSVar15,pcVar13,sVar9,&local_50,(size_t *)0x0,true);
    if (CVar6 == CURLE_OK) {
      pcVar13 = pcVar12 + 1;
      sVar9 = 0xffffffffffffffff;
      do {
        pcVar11 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
        _Var5 = imap_is_bchar(*pcVar11);
        sVar9 = sVar9 + 1;
      } while (_Var5);
      CVar6 = Curl_urldecode(pSVar15,pcVar13,sVar9,&local_60,&local_48,true);
      if (CVar6 != CURLE_OK) {
        uVar10 = (ulong)CVar6;
        if (local_50 != (char *)0x0) {
          (*Curl_cfree)(local_50);
          local_50 = (char *)0x0;
        }
        goto LAB_00484e19;
      }
      iVar7 = Curl_raw_equal(local_50,"UIDVALIDITY");
      if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x10) != 0)) {
        iVar7 = Curl_raw_equal(local_50,"UID");
        if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x18) != 0)) {
          iVar7 = Curl_raw_equal(local_50,"SECTION");
          if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x20) != 0)) {
            iVar7 = Curl_raw_equal(local_50,"PARTIAL");
            if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x28) != 0)) {
              if (local_50 != (char *)0x0) {
                (*Curl_cfree)(local_50);
                local_50 = (char *)0x0;
              }
              uVar10 = 3;
              if (local_60 != (char *)0x0) {
                (*Curl_cfree)(local_60);
                local_60 = (char *)0x0;
              }
              goto LAB_00484e19;
            }
            if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
              local_60[local_48 - 1] = '\0';
            }
            *(char **)((long)local_58 + 0x28) = local_60;
          }
          else {
            if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
              local_60[local_48 - 1] = '\0';
            }
            *(char **)((long)local_58 + 0x20) = local_60;
          }
        }
        else {
          if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
            local_60[local_48 - 1] = '\0';
          }
          *(char **)((long)local_58 + 0x18) = local_60;
        }
      }
      else {
        if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
          local_60[local_48 - 1] = '\0';
        }
        *(char **)((long)local_58 + 0x10) = local_60;
      }
      local_60 = (char *)0x0;
      if (local_50 != (char *)0x0) {
        (*Curl_cfree)(local_50);
        local_50 = (char *)0x0;
      }
      bVar3 = true;
      if (local_60 != (char *)0x0) {
        (*Curl_cfree)(local_60);
        local_60 = (char *)0x0;
      }
    }
    else {
      uVar10 = (ulong)CVar6;
    }
  }
  CVar6 = (CURLcode)uVar10;
  if (!bVar3) goto LAB_004850c4;
  goto LAB_00484dc8;
code_r0x00484de8:
  pcVar12 = pcVar12 + 1;
  sVar9 = sVar9 + 1;
  goto LAB_00484ddb;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}